

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t *
roaring_bitmap_lazy_or(roaring_bitmap_t *x1,roaring_bitmap_t *x2,_Bool bitsetconversion)

{
  byte bVar1;
  uint8_t *puVar2;
  ushort uVar3;
  uint uVar4;
  container_t *pcVar5;
  ulong uVar6;
  roaring_bitmap_t *prVar7;
  array_container_t *ac;
  array_container_t *c;
  ulong uVar8;
  undefined7 in_register_00000011;
  int iVar9;
  roaring_array_t *sa;
  roaring_array_t *ra;
  void **ppvVar10;
  int iVar11;
  long *plVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  uint16_t key;
  uint8_t result_type;
  uint8_t type1;
  uint8_t type2;
  uint8_t local_8b;
  uint8_t local_8a;
  uint8_t local_89 [15];
  uint16_t local_7a;
  long *local_78;
  ulong local_70;
  ulong local_68;
  roaring_array_t *local_60;
  ulong local_58;
  roaring_array_t *local_50;
  undefined4 local_44;
  ulong local_40;
  ulong local_38;
  
  local_8b = '\0';
  uVar16 = (x1->high_low_container).size;
  prVar7 = x2;
  if (uVar16 != 0) {
    uVar13 = (x2->high_low_container).size;
    prVar7 = x1;
    if (uVar13 != 0) {
      local_44 = (undefined4)CONCAT71(in_register_00000011,bitsetconversion);
      local_60 = &roaring_bitmap_create_with_capacity(uVar16 + uVar13)->high_low_container;
      if ((((x1->high_low_container).flags & 1) == 0) && (((x2->high_low_container).flags & 1) == 0)
         ) {
        local_60->flags = local_60->flags & 0xfe;
      }
      else {
        local_60->flags = local_60->flags | 1;
      }
      local_7a = *(x1->high_low_container).keys;
      key = *(x2->high_low_container).keys;
      local_38 = (ulong)-uVar13;
      local_70 = 0;
      plVar12 = (long *)0x0;
      uVar17 = local_38;
      local_58 = (ulong)uVar16;
      local_50 = &x1->high_low_container;
      local_40 = (ulong)uVar13;
LAB_00105b95:
      do {
        iVar11 = (int)plVar12;
        local_68 = (ulong)plVar12 & 0xffffffff;
        iVar9 = (int)uVar17 + iVar11;
        lVar15 = 0;
        local_78 = plVar12;
        while( true ) {
          uVar17 = local_38;
          sa = local_50;
          uVar3 = (short)local_68 + (short)lVar15;
          iVar14 = (int)lVar15;
          uVar16 = (uint)local_70;
          if (local_7a == key) break;
          if (local_7a < key) {
            local_8a = local_50->typecodes[local_70 & 0xffff];
            pcVar5 = get_copy_of_container
                               (local_50->containers[local_70 & 0xffff],&local_8a,
                                (_Bool)(local_50->flags & 1));
            ra = local_60;
            if ((sa->flags & 1) != 0) {
              sa->containers[(int)uVar16] = pcVar5;
              sa->typecodes[(int)uVar16] = local_8a;
            }
            ra_append(local_60,local_7a,pcVar5,local_8a);
            uVar16 = uVar16 + 1;
            uVar13 = (uint)local_58;
            if (uVar16 != uVar13) {
              local_7a = sa->keys[(ulong)uVar16 & 0xffff];
            }
            if (uVar16 == uVar13) {
              uVar4 = iVar14 + (int)local_68;
              goto LAB_0010605a;
            }
            plVar12 = (long *)(ulong)(uint)((int)local_68 + iVar14);
            uVar17 = local_38;
            local_70 = (ulong)uVar16;
            goto LAB_00105b95;
          }
          local_89[0] = (x2->high_low_container).typecodes[uVar3];
          pcVar5 = get_copy_of_container
                             ((x2->high_low_container).containers[uVar3],local_89,
                              (_Bool)((x2->high_low_container).flags & 1));
          if (((x2->high_low_container).flags & 1) != 0) {
            (x2->high_low_container).containers[iVar11 + lVar15] = pcVar5;
            (x2->high_low_container).typecodes[lVar15 + iVar11] = local_89[0];
          }
          ra_append(local_60,key,pcVar5,local_89[0]);
          if (iVar9 + iVar14 != -1) {
            key = (x2->high_low_container).keys[(ushort)((short)local_68 + (short)lVar15 + 1)];
          }
          lVar15 = lVar15 + 1;
          if ((int)lVar15 + iVar9 == 0) {
            uVar4 = (int)local_78 + (int)lVar15;
            uVar13 = (uint)local_58;
            uVar16 = (uint)local_70;
            sa = local_50;
            ra = local_60;
            goto LAB_0010605a;
          }
        }
        local_8a = local_50->typecodes[uVar16 & 0xffff];
        uVar6 = CONCAT71((int7)((ulong)local_50->typecodes >> 8),local_8a);
        uVar13 = (uint)uVar6;
        ac = (array_container_t *)local_50->containers[uVar16 & 0xffff];
        puVar2 = (x2->high_low_container).typecodes;
        uVar4 = (int)local_68 + iVar14 & 0xffff;
        local_89[0] = puVar2[uVar4];
        uVar8 = CONCAT71((int7)((ulong)puVar2 >> 8),local_89[0]);
        uVar16 = (uint)uVar8;
        ppvVar10 = (x2->high_low_container).containers;
        plVar12 = (long *)ppvVar10[uVar4];
        if ((char)local_44 == '\0') {
LAB_00105cdd:
          if (local_8a == '\x04') {
            uVar13 = (uint)*(byte *)&ac->array;
            ac = *(array_container_t **)ac;
          }
          if (local_89[0] == '\x04') {
            uVar16 = (uint)*(byte *)(plVar12 + 1);
            plVar12 = (long *)*plVar12;
          }
          local_89[1] = '\0';
          local_89[2] = '\0';
          local_89[3] = '\0';
          local_89[4] = '\0';
          local_89[5] = '\0';
          local_89[6] = '\0';
          local_89[7] = '\0';
          local_89[8] = '\0';
          prVar7 = (roaring_bitmap_t *)
                   (*(code *)(&DAT_001210a0 +
                             *(int *)(&DAT_001210a0 +
                                     (ulong)(((uVar16 & 0xff) + (uVar13 & 0xff) * 4) - 5) * 4)))
                             (ac,ppvVar10,plVar12);
          return prVar7;
        }
        ppvVar10 = (void **)(uVar6 & 0xffffffff);
        if (local_8a == '\x04') {
          ppvVar10 = (void **)CONCAT71((int7)((ulong)ppvVar10 >> 8),*(undefined1 *)&ac->array);
        }
        if ((char)ppvVar10 == '\x01') goto LAB_00105cdd;
        ppvVar10 = (void **)(uVar8 & 0xffffffff);
        if (local_89[0] == '\x04') {
          ppvVar10 = (void **)CONCAT71((int7)((ulong)ppvVar10 >> 8),(char)plVar12[1]);
        }
        if ((char)ppvVar10 == '\x01') goto LAB_00105cdd;
        if (local_8a == '\x04') {
          local_8a = *(uint8_t *)&ac->array;
          ac = *(array_container_t **)ac;
        }
        if (local_8a != '\x01') {
          if (local_8a == '\x03') {
            ac = (array_container_t *)bitset_container_from_run((run_container_t *)ac);
          }
          else {
            local_78 = plVar12;
            ac = (array_container_t *)bitset_container_from_array(ac);
            plVar12 = local_78;
          }
        }
        local_8a = '\x01';
        c = (array_container_t *)container_lazy_ior(ac,'\x01',plVar12,local_89[0],&local_8b);
        if (c != ac) {
          container_free(ac,local_8a);
        }
        ra_append(local_60,local_7a,c,local_8b);
        uVar16 = (int)local_70 + 1;
        local_70 = (ulong)uVar16;
        plVar12 = (long *)(local_68 + lVar15 + 1);
        uVar13 = (uint)local_58;
        if ((int)local_68 + (int)uVar17 + iVar14 == -1 || uVar16 == uVar13) {
          uVar4 = iVar14 + (int)local_68 + 1;
          ra = local_60;
LAB_0010605a:
          if (uVar16 == uVar13) {
            bVar1 = (x2->high_low_container).flags;
            sa = &x2->high_low_container;
            uVar13 = (uint)local_40;
            uVar16 = uVar4;
          }
          else {
            if (uVar4 != (uint)local_40) {
              return (roaring_bitmap_t *)ra;
            }
            bVar1 = sa->flags;
          }
          ra_append_copy_range(ra,sa,uVar16,uVar13,(_Bool)(bVar1 & 1));
          return (roaring_bitmap_t *)ra;
        }
        local_7a = sa->keys[uVar16 & 0xffff];
        key = (x2->high_low_container).keys[(uint)plVar12 & 0xffff];
      } while( true );
    }
  }
  prVar7 = roaring_bitmap_copy(prVar7);
  return prVar7;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_lazy_or(const roaring_bitmap_t *x1,
                                         const roaring_bitmap_t *x2,
                                         const bool bitsetconversion) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c;
            if (bitsetconversion &&
                (get_container_type(c1, type1) != BITSET_CONTAINER_TYPE) &&
                (get_container_type(c2, type2) != BITSET_CONTAINER_TYPE)) {
                container_t *newc1 =
                    container_mutable_unwrap_shared(c1, &type1);
                newc1 = container_to_bitset(newc1, type1);
                type1 = BITSET_CONTAINER_TYPE;
                c = container_lazy_ior(newc1, type1, c2, type2, &result_type);
                if (c != newc1) {  // should not happen
                    container_free(newc1, type1);
                }
            } else {
                c = container_lazy_or(c1, type1, c2, type2, &result_type);
            }
            // since we assume that the initial containers are non-empty,
            // the
            // result here
            // can only be non-empty
            ra_append(&answer->high_low_container, s1, c, result_type);
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}